

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int P_FindUniqueTID(int start_tid,int limit)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  AActor *pAVar5;
  int iVar6;
  
  if (start_tid == 0) {
    iVar4 = 0x7fffffff;
    if (limit != 0) {
      iVar4 = limit;
    }
    if (0 < iVar4) {
      iVar6 = 0;
      do {
        uVar2 = FRandom::GenRand32(&pr_uniquetid);
        iVar3 = P_FindUniqueTID((uVar2 & 0x7fffffff) + (uint)((uVar2 & 0x7fffffff) == 0),5);
        if (iVar3 != 0) {
          return iVar3;
        }
        iVar6 = iVar6 + 5;
      } while (iVar6 < iVar4);
    }
  }
  else {
    iVar4 = start_tid + limit + -1;
    uVar2 = start_tid;
    if (-0x80000000 - limit < start_tid || start_tid <= iVar4) {
      do {
        if (uVar2 != 0) {
          for (pAVar5 = AActor::TIDHash[uVar2 & 0x7f];
              (pAVar5 != (AActor *)0x0 && (pAVar5->tid != uVar2)); pAVar5 = pAVar5->inext) {
          }
          if (pAVar5 == (AActor *)0x0) {
            return uVar2;
          }
        }
        bVar1 = (int)uVar2 < iVar4;
        uVar2 = uVar2 + 1;
      } while (-0x80000000 - limit < start_tid || bVar1);
    }
  }
  return 0;
}

Assistant:

int P_FindUniqueTID(int start_tid, int limit)
{
	int tid;

	if (start_tid != 0)
	{ // Do a linear search.
		if (start_tid > INT_MAX-limit+1)
		{ // If 'limit+start_tid-1' overflows, clamp 'limit' to INT_MAX
			limit = INT_MAX;
		}
		else
		{
			limit += start_tid-1;
		}
		for (tid = start_tid; tid <= limit; ++tid)
		{
			if (tid != 0 && !P_IsTIDUsed(tid))
			{
				return tid;
			}
		}
		// Nothing free found.
		return 0;
	}
	// Do a random search. To try and be a bit more performant, this
	// actually does several linear searches. In the case of *very*
	// dense TID usage, this could potentially perform worse than doing
	// a complete linear scan starting at 1. However, you would need
	// to use an absolutely ridiculous number of actors before this
	// becomes a real concern.
	if (limit == 0)
	{
		limit = INT_MAX;
	}
	for (int i = 0; i < limit; i += 5)
	{
		// Use a positive starting TID.
		tid = pr_uniquetid.GenRand32() & INT_MAX;
		tid = P_FindUniqueTID(tid == 0 ? 1 : tid, 5);
		if (tid != 0)
		{
			return tid;
		}
	}
	// Nothing free found.
	return 0;
}